

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  uint *puVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int in_ESI;
  undefined8 *in_RDI;
  int c;
  int v_max;
  int h_max;
  int q;
  int i;
  int p;
  int Lf;
  stbi__context *s;
  stbi__context *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_38;
  uint local_34;
  int local_2c;
  int local_4;
  
  puVar1 = (uint *)*in_RDI;
  local_34 = 1;
  local_38 = 1;
  iVar4 = stbi__get16be((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar4 < 0xb) {
    local_4 = stbi__err("bad SOF len");
  }
  else {
    sVar2 = stbi__get8(in_stack_ffffffffffffffa8);
    if (sVar2 == '\b') {
      uVar5 = stbi__get16be((stbi__context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      puVar1[1] = uVar5;
      if (puVar1[1] == 0) {
        local_4 = stbi__err("no header height");
      }
      else {
        uVar5 = stbi__get16be((stbi__context *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        *puVar1 = uVar5;
        if (*puVar1 == 0) {
          local_4 = stbi__err("0 width");
        }
        else if (puVar1[1] < 0x1000001) {
          if (*puVar1 < 0x1000001) {
            bVar3 = stbi__get8(in_stack_ffffffffffffffa8);
            uVar5 = (uint)bVar3;
            if (((uVar5 == 3) || (uVar5 == 1)) || (uVar5 == 4)) {
              puVar1[2] = uVar5;
              for (local_2c = 0; local_2c < (int)uVar5; local_2c = local_2c + 1) {
                in_RDI[(long)local_2c * 0xc + 0x8da] = 0;
                in_RDI[(long)local_2c * 0xc + 0x8dd] = 0;
              }
              if (iVar4 == puVar1[2] * 3 + 8) {
                *(undefined4 *)(in_RDI + 0x90a) = 0;
                for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                  bVar3 = stbi__get8(in_stack_ffffffffffffffa8);
                  *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8d4) = (uint)bVar3;
                  if ((puVar1[2] == 3) &&
                     (*(uint *)(in_RDI + (long)local_2c * 0xc + 0x8d4) == (uint)"RGB"[local_2c])) {
                    *(int *)(in_RDI + 0x90a) = *(int *)(in_RDI + 0x90a) + 1;
                  }
                  bVar3 = stbi__get8(in_stack_ffffffffffffffa8);
                  *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4) = (int)(uint)bVar3 >> 4;
                  if ((*(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4) == 0) ||
                     (4 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4))) {
                    iVar4 = stbi__err("bad H");
                    return iVar4;
                  }
                  *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8d5) = bVar3 & 0xf;
                  if ((*(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5) == 0) ||
                     (4 < *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5))) {
                    iVar4 = stbi__err("bad V");
                    return iVar4;
                  }
                  bVar3 = stbi__get8(in_stack_ffffffffffffffa8);
                  *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x46ac) = (uint)bVar3;
                  if (3 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46ac)) {
                    iVar4 = stbi__err("bad TQ");
                    return iVar4;
                  }
                }
                if (in_ESI == 0) {
                  iVar4 = stbi__mad3sizes_valid
                                    (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                     (int)in_stack_ffffffffffffffa8);
                  if (iVar4 == 0) {
                    local_4 = stbi__err("too large");
                  }
                  else {
                    for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                      if ((int)local_34 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4)) {
                        local_34 = *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4);
                      }
                      if ((int)local_38 < *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5)) {
                        local_38 = *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8d5);
                      }
                    }
                    for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                      if ((int)local_34 % *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4) !=
                          0) {
                        iVar4 = stbi__err("bad H");
                        return iVar4;
                      }
                      if ((int)local_38 % *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5) != 0) {
                        iVar4 = stbi__err("bad V");
                        return iVar4;
                      }
                    }
                    *(uint *)(in_RDI + 0x8d1) = local_34;
                    *(uint *)((long)in_RDI + 0x468c) = local_38;
                    *(uint *)(in_RDI + 0x8d3) = local_34 << 3;
                    *(uint *)((long)in_RDI + 0x469c) = local_38 << 3;
                    *(uint *)(in_RDI + 0x8d2) =
                         ((*puVar1 + *(int *)(in_RDI + 0x8d3)) - 1) / *(uint *)(in_RDI + 0x8d3);
                    *(uint *)((long)in_RDI + 0x4694) =
                         ((puVar1[1] + *(int *)((long)in_RDI + 0x469c)) - 1) /
                         *(uint *)((long)in_RDI + 0x469c);
                    for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                      *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x46bc) =
                           ((*puVar1 * *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4) +
                            local_34) - 1) / local_34;
                      *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8d8) =
                           ((puVar1[1] * *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5) + local_38)
                           - 1) / local_38;
                      *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46c4) =
                           *(int *)(in_RDI + 0x8d2) *
                           *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46a4) * 8;
                      *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d9) =
                           *(int *)((long)in_RDI + 0x4694) *
                           *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d5) * 8;
                      in_RDI[(long)local_2c * 0xc + 0x8de] = 0;
                      in_RDI[(long)local_2c * 0xc + 0x8dc] = 0;
                      in_RDI[(long)local_2c * 0xc + 0x8dd] = 0;
                      pvVar6 = stbi__malloc_mad2((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                                 (int)in_stack_ffffffffffffffa8,0);
                      in_RDI[(long)local_2c * 0xc + 0x8db] = pvVar6;
                      if (in_RDI[(long)local_2c * 0xc + 0x8db] == 0) {
                        stbi__err("outofmem");
                        iVar4 = stbi__free_jpeg_components
                                          ((stbi__jpeg *)
                                           CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),
                                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                           (int)in_stack_ffffffffffffffa8);
                        return iVar4;
                      }
                      in_RDI[(long)local_2c * 0xc + 0x8da] =
                           in_RDI[(long)local_2c * 0xc + 0x8db] + 0xf & 0xfffffffffffffff0;
                      if (*(int *)(in_RDI + 0x906) != 0) {
                        *(int *)(in_RDI + (long)local_2c * 0xc + 0x8df) =
                             *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46c4) / 8;
                        *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x46fc) =
                             *(int *)(in_RDI + (long)local_2c * 0xc + 0x8d9) / 8;
                        pvVar6 = stbi__malloc_mad3((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                                   (int)in_stack_ffffffffffffffa8,0,0x16753e);
                        in_RDI[(long)local_2c * 0xc + 0x8dc] = pvVar6;
                        if (in_RDI[(long)local_2c * 0xc + 0x8dc] == 0) {
                          local_2c = local_2c + 1;
                          stbi__err("outofmem");
                          iVar4 = stbi__free_jpeg_components
                                            ((stbi__jpeg *)
                                             CONCAT44(local_2c,in_stack_ffffffffffffffb0),
                                             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
                          return iVar4;
                        }
                        in_RDI[(long)local_2c * 0xc + 0x8de] =
                             in_RDI[(long)local_2c * 0xc + 0x8dc] + 0xf & 0xfffffffffffffff0;
                      }
                    }
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = stbi__err("bad SOF len");
              }
            }
            else {
              local_4 = stbi__err("bad component count");
            }
          }
          else {
            local_4 = stbi__err("too large");
          }
        }
        else {
          local_4 = stbi__err("too large");
        }
      }
    }
    else {
      local_4 = stbi__err("only 8-bit");
    }
  }
  return local_4;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}